

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDeferredTestReporter.cpp
# Opt level: O0

void __thiscall
UnitTest::anon_unknown_0::
TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage::
TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage
          (TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage *this)

{
  char *suiteName;
  TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  Test::Test(&this->super_Test,"DeferredTestReporterTakesCopyOfFailureMessage",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestDeferredTestReporter.cpp"
             ,0x62);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage_00184100;
  return;
}

Assistant:

TEST_FIXTURE(DeferredTestReporterFixture, DeferredTestReporterTakesCopyOfFailureMessage)
{
    reporter.ReportTestStart(details);

    char failureMessage[128];
    char const* goodStr = "Real failure message";
    char const* badStr = "Bogus failure message";
    
	using namespace std;

    strcpy(failureMessage, goodStr);
    reporter.ReportFailure(details, failureMessage);
    strcpy(failureMessage, badStr);

    DeferredTestResult const& result = reporter.GetResults().at(0);
    DeferredTestResult::Failure const& failure = result.failures.at(0);
    CHECK_EQUAL(goodStr, failure.second);
}